

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O2

void __thiscall re2::BitState::GrowStack(BitState *this)

{
  PODArray<re2::Job> tmp;
  __uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter> _Stack_28;
  
  PODArray<re2::Job>::PODArray
            ((PODArray<re2::Job> *)&_Stack_28,
             (int)(this->job_).ptr_._M_t.
                  super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
                  super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
                  super__Tuple_impl<1UL,_re2::PODArray<re2::Job>::Deleter>.
                  super__Head_base<1UL,_re2::PODArray<re2::Job>::Deleter,_false> * 2);
  memmove(_Stack_28._M_t.super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
          super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl,
          (this->job_).ptr_._M_t.super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>.
          _M_t.super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
          super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl,(long)this->njob_ << 4);
  std::__uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>::operator=
            ((__uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter> *)&this->job_,&_Stack_28);
  std::unique_ptr<re2::Job[],_re2::PODArray<re2::Job>::Deleter>::~unique_ptr
            ((unique_ptr<re2::Job[],_re2::PODArray<re2::Job>::Deleter> *)&_Stack_28);
  return;
}

Assistant:

void BitState::GrowStack() {
  PODArray<Job> tmp(2*job_.size());
  memmove(tmp.data(), job_.data(), njob_*sizeof job_[0]);
  job_ = std::move(tmp);
}